

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::FuncTypeModuleField::~FuncTypeModuleField(FuncTypeModuleField *this)

{
  pointer pTVar1;
  pointer pcVar2;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__FuncTypeModuleField_0155aff0;
  pTVar1 = (this->func_type).sig.result_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1);
  }
  pTVar1 = (this->func_type).sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1);
  }
  pcVar2 = (this->func_type).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->func_type).name.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

explicit FuncTypeModuleField(const Location& loc = Location(),
                               string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::FuncType>(loc), func_type(name) {}